

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

void ogt_vox_destroy_scene(ogt_vox_scene *_scene)

{
  uint local_1c;
  uint32_t i;
  ogt_vox_scene *scene;
  ogt_vox_scene *_scene_local;
  
  for (local_1c = 0; local_1c < _scene->num_models; local_1c = local_1c + 1) {
    _vox_free(_scene->models[local_1c]);
  }
  if (_scene->models != (ogt_vox_model **)0x0) {
    _vox_free(_scene->models);
    _scene->models = (ogt_vox_model **)0x0;
  }
  if (_scene->instances != (ogt_vox_instance *)0x0) {
    _vox_free(_scene->instances);
    _scene->instances = (ogt_vox_instance *)0x0;
  }
  if (_scene->cameras != (ogt_vox_cam *)0x0) {
    _vox_free(_scene->cameras);
    _scene->cameras = (ogt_vox_cam *)0x0;
  }
  if (_scene->layers != (ogt_vox_layer *)0x0) {
    _vox_free(_scene->layers);
    _scene->layers = (ogt_vox_layer *)0x0;
  }
  if (_scene->groups != (ogt_vox_group *)0x0) {
    _vox_free(_scene->groups);
    _scene->groups = (ogt_vox_group *)0x0;
  }
  _vox_free(_scene);
  return;
}

Assistant:

void ogt_vox_destroy_scene(const ogt_vox_scene * _scene) {
        ogt_vox_scene* scene = const_cast<ogt_vox_scene*>(_scene);
        // free models from model array
        for (uint32_t i = 0; i < scene->num_models; i++)
            _vox_free((void*)scene->models[i]);
        // free model array itself
        if (scene->models) {
            _vox_free(scene->models);
            scene->models = NULL;
        }
        // free instance array
        if (scene->instances) {
            _vox_free(const_cast<ogt_vox_instance*>(scene->instances));
            scene->instances = NULL;
        }
        // free cameras array
        if (scene->cameras) {
            _vox_free(const_cast<ogt_vox_cam*>(scene->cameras));
            scene->cameras = NULL;
        }
        // free layer array
        if (scene->layers) {
            _vox_free(const_cast<ogt_vox_layer*>(scene->layers));
            scene->layers = NULL;
        }
        // free groups array
        if (scene->groups) {
            _vox_free(const_cast<ogt_vox_group*>(scene->groups));
            scene->groups = NULL;
        }
        // finally, free the scene.
        _vox_free(scene);
    }